

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-ecc-impl.c
# Opt level: O2

int ndn_lite_default_ecdsa_sign
              (uint8_t *input_value,uint32_t input_size,uint8_t *output_value,
              uint32_t output_max_size,abstract_ecc_prv_key *abs_key,uint8_t ecdsa_type,
              uint32_t *output_used_size)

{
  int iVar1;
  undefined1 local_140 [8];
  uECC_SHA256_HashContext HashContext;
  uint8_t tmp [128];
  uint32_t local_1c [2];
  uint32_t encoded_sig_length;
  
  if (output_max_size < 0x40) {
    iVar1 = -10;
  }
  else if (abs_key->key_size < 0x21) {
    if (ecdsa_type == ' ') {
      local_140 = (undefined1  [8])_init_sha256;
      HashContext.uECC.init_hash = _update_sha256;
      HashContext.uECC.update_hash = _finish_sha256;
      HashContext.uECC.finish_hash = (_func_void_uECC_HashContext_ptr_uint8_t_ptr *)0x2000000040;
      HashContext.uECC._24_8_ = &HashContext.ctx.leftover_offset;
      iVar1 = uECC_sign_deterministic
                        (abs_key->key_value,input_value,(uECC_HashContext *)local_140,output_value);
      if (iVar1 == 0) {
        iVar1 = -0x19;
      }
      else {
        iVar1 = ndn_asn1_probe_ecdsa_signature_encoding_size(output_value,0x40,local_1c);
        if (iVar1 == 0) {
          iVar1 = ndn_asn1_encode_ecdsa_signature(output_value,0x40,output_max_size);
          if (iVar1 == 0) {
            *output_used_size = local_1c[0];
            iVar1 = 0;
          }
        }
      }
      return iVar1;
    }
    iVar1 = -0x1a;
  }
  else {
    iVar1 = -0x16;
  }
  return iVar1;
}

Assistant:

int
ndn_lite_default_ecdsa_sign(const uint8_t* input_value, uint32_t input_size,
                            uint8_t* output_value, uint32_t output_max_size,
                            const struct abstract_ecc_prv_key* abs_key,
                            uint8_t ecdsa_type, uint32_t* output_used_size)
{
  if (output_max_size < NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE)
    return NDN_OVERSIZE;
  if (abs_key->key_size > NDN_SEC_ECC_SECP256R1_PRIVATE_KEY_SIZE)
    return NDN_SEC_WRONG_KEY_SIZE;
  if (ecdsa_type != NDN_ECDSA_CURVE_SECP256R1)
    return NDN_SEC_UNSUPPORT_CRYPTO_ALGO;

  uint32_t signature_size = NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE;
  int ecc_sign_result = 0;

#ifndef FEATURE_PERIPH_HWRNG
  uint8_t tmp[NDN_SEC_ECC_SECP256R1_PRIVATE_KEY_SIZE +
              NDN_SEC_ECC_SECP256R1_PRIVATE_KEY_SIZE +
              NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE];
  uECC_SHA256_HashContext HashContext;
  uECC_SHA256_HashContext* ctx = &HashContext;
  ctx->uECC.init_hash = &_init_sha256;
  ctx->uECC.update_hash = &_update_sha256;
  ctx->uECC.finish_hash = &_finish_sha256;
  ctx->uECC.block_size = NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE;
  ctx->uECC.result_size = NDN_SEC_ECC_SECP256R1_PRIVATE_KEY_SIZE;
  ctx->uECC.tmp = tmp;

  ecc_sign_result = uECC_sign_deterministic(abs_key->key_value, input_value,
                                            &ctx->uECC, output_value);
#else
  ecc_sign_result = uECC_sign(abs_key->key_value, input_value, output_value);
#endif
  if (ecc_sign_result == 0) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }

  uint32_t encoded_sig_length;
  int ret_val = ndn_asn1_probe_ecdsa_signature_encoding_size(output_value, signature_size,
                                                             &encoded_sig_length);
  if (ret_val != NDN_SUCCESS) {
    return ret_val;
  }

  ret_val = ndn_asn1_encode_ecdsa_signature(output_value, signature_size, output_max_size);
  if (ret_val != NDN_SUCCESS) {
    return ret_val;
  }

  *output_used_size = encoded_sig_length;

  return NDN_SUCCESS;
}